

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

void __thiscall
t_rs_generator::render_thrift_error
          (t_rs_generator *this,string *error_kind,string *error_struct,string *sub_error_kind,
          string *error_message)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  string local_60;
  string *local_40;
  string *local_38;
  
  poVar1 = &this->f_gen_;
  local_40 = sub_error_kind;
  local_38 = error_message;
  t_generator::indent_abi_cxx11_(&local_60,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Err(",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar3 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_60,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"thrift::Error::",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(error_kind->_M_dataplus)._M_p,error_kind->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  render_thrift_error_struct(this,error_struct,local_40,local_38);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_60,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_60,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::render_thrift_error(
  const string& error_kind,
  const string& error_struct,
  const string& sub_error_kind,
  const string& error_message
) {
  f_gen_ << indent() << "Err(" << endl;
  indent_up();
  f_gen_ << indent() << "thrift::Error::" << error_kind << "(" << endl;
  indent_up();
  render_thrift_error_struct(error_struct, sub_error_kind, error_message);
  indent_down();
  f_gen_ << indent() << ")" << endl;
  indent_down();
  f_gen_ << indent() << ")" << endl;
}